

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O1

void __thiscall TTD::FileWriter::WriteBlock(FileWriter *this,byte *buff,size_t bufflen)

{
  size_t local_10;
  size_t bwp;
  
  if (bufflen == 0) {
    TTDAbort_unrecoverable_error("Shouldn\'t be writing empty blocks");
  }
  if (this->m_hfile != (JsTTDStreamHandle)0x0) {
    local_10 = 0;
    (*this->m_pfWrite)(this->m_hfile,buff,bufflen,&local_10);
    return;
  }
  TTDAbort_unrecoverable_error("Trying to write to closed file.");
}

Assistant:

void FileWriter::WriteBlock(const byte* buff, size_t bufflen)
    {
        TTDAssert(bufflen != 0, "Shouldn't be writing empty blocks");
        TTDAssert(this->m_hfile != nullptr, "Trying to write to closed file.");

        size_t bwp = 0;
        this->m_pfWrite(this->m_hfile, buff, bufflen, &bwp);
    }